

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O2

bool tcu::bilinearCompare
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
               PixelBufferAccess *errorMask,RGBA threshold)

{
  bool bVar1;
  InternalError *this;
  bool bVar2;
  int y;
  int y_00;
  int x;
  int x_00;
  allocator<char> local_61;
  PixelBufferAccess *local_60;
  string local_58;
  
  local_60 = errorMask;
  if (((reference->m_format).order == RGBA) && ((reference->m_format).type == UNORM_INT8)) {
    local_58._M_dataplus._M_p = (pointer)0x3f80000000000000;
    local_58._M_string_length = 0x3f80000000000000;
    clear(errorMask,(Vec4 *)&local_58);
    bVar2 = true;
    for (y_00 = 0; y_00 < (reference->m_size).m_data[1]; y_00 = y_00 + 1) {
      for (x_00 = 0; x_00 < (reference->m_size).m_data[0]; x_00 = x_00 + 1) {
        bVar1 = anon_unknown_0::comparePixelRGBA8(reference,result,threshold,x_00,y_00);
        if (!bVar1) {
          bVar1 = anon_unknown_0::comparePixelRGBA8(result,reference,threshold,x_00,y_00);
          if (!bVar1) {
            local_58._M_dataplus._M_p = (pointer)0x3f800000;
            local_58._M_string_length = 0x3f80000000000000;
            bVar2 = false;
            PixelBufferAccess::setPixel(local_60,(Vec4 *)&local_58,x_00,y_00,0);
          }
        }
      }
    }
    return bVar2;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Unsupported format for bilinear comparison",&local_61);
  InternalError::InternalError(this,&local_58);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

bool bilinearCompare (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const PixelBufferAccess& errorMask, const RGBA threshold)
{
	DE_ASSERT(reference.getWidth()	== result.getWidth()	&&
			  reference.getHeight()	== result.getHeight()	&&
			  reference.getDepth()	== result.getDepth()	&&
			  reference.getFormat()	== result.getFormat());
	DE_ASSERT(reference.getWidth()	== errorMask.getWidth()		&&
			  reference.getHeight()	== errorMask.getHeight()	&&
			  reference.getDepth()	== errorMask.getDepth());

	if (reference.getFormat() == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
		return bilinearCompareRGBA8(reference, result, errorMask, threshold);
	else
		throw InternalError("Unsupported format for bilinear comparison");
}